

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O2

bool __thiscall
google::protobuf::io::CodedInputStream::DecrementRecursionDepthAndPopLimit
          (CodedInputStream *this,Limit limit)

{
  CodedInputStream CVar1;
  string *psVar2;
  LogMessageFatal local_20 [16];
  
  CVar1 = this[0x24];
  PopLimit(this,limit);
  psVar2 = absl::lts_20240722::log_internal::Check_LTImpl_abi_cxx11_
                     (*(int *)(this + 0x34),*(int *)(this + 0x38),
                      "recursion_budget_ < recursion_limit_");
  if (psVar2 == (string *)0x0) {
    *(int *)(this + 0x34) = *(int *)(this + 0x34) + 1;
    return (bool)CVar1;
  }
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            (local_20,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/io/coded_stream.cc"
             ,0x9e,psVar2->_M_string_length,(psVar2->_M_dataplus)._M_p);
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_20);
}

Assistant:

bool CodedInputStream::DecrementRecursionDepthAndPopLimit(Limit limit) {
  bool result = ConsumedEntireMessage();
  PopLimit(limit);
  ABSL_DCHECK_LT(recursion_budget_, recursion_limit_);
  ++recursion_budget_;
  return result;
}